

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_7::Validator::CheckTableVar(Validator *this,Var *var,Table **out_table)

{
  bool bVar1;
  Result result;
  size_type sVar2;
  const_reference ppTVar3;
  uint local_2c;
  Table **ppTStack_28;
  Index index;
  Table **out_table_local;
  Var *var_local;
  Validator *this_local;
  
  ppTStack_28 = out_table;
  out_table_local = (Table **)var;
  var_local = (Var *)this;
  sVar2 = std::vector<wabt::Table_*,_std::allocator<wabt::Table_*>_>::size
                    (&this->current_module_->tables);
  result = CheckVar(this,(Index)sVar2,(Var *)out_table_local,"table",&local_2c);
  bVar1 = Failed(result);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    if (ppTStack_28 != (Table **)0x0) {
      ppTVar3 = std::vector<wabt::Table_*,_std::allocator<wabt::Table_*>_>::operator[]
                          (&this->current_module_->tables,(ulong)local_2c);
      *ppTStack_28 = *ppTVar3;
    }
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result Validator::CheckTableVar(const Var* var, const Table** out_table) {
  Index index;
  CHECK_RESULT(CheckVar(current_module_->tables.size(), var, "table", &index));
  if (out_table) {
    *out_table = current_module_->tables[index];
  }
  return Result::Ok;
}